

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O3

Offset __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteFixupU32Leb128Size
          (BinaryWriter *this,Offset offset,Offset leb_size_guess,char *desc)

{
  Offset OVar1;
  Offset src_offset;
  Offset delta;
  uint32_t value;
  size_t sVar2;
  
  sVar2 = this->stream_->offset_;
  if (this->options_->canonicalize_lebs == true) {
    sVar2 = sVar2 - (leb_size_guess + offset);
    value = (uint32_t)sVar2;
    OVar1 = U32Leb128Length(value);
    delta = OVar1 - leb_size_guess;
    if (delta != 0) {
      Stream::MoveData(this->stream_,OVar1 + offset,leb_size_guess + offset,sVar2);
    }
    WriteU32Leb128At(this->stream_,offset,value,desc);
    Stream::AddOffset(this->stream_,delta);
  }
  else {
    WriteFixedU32Leb128At(this->stream_,offset,((int)sVar2 - (int)offset) - 5,desc);
    delta = 0;
  }
  return delta;
}

Assistant:

Offset BinaryWriter::WriteFixupU32Leb128Size(Offset offset,
                                             Offset leb_size_guess,
                                             const char* desc) {
  if (options_.canonicalize_lebs) {
    Offset size = stream_->offset() - offset - leb_size_guess;
    Offset leb_size = U32Leb128Length(size);
    Offset delta = leb_size - leb_size_guess;
    if (delta != 0) {
      Offset src_offset = offset + leb_size_guess;
      Offset dst_offset = offset + leb_size;
      stream_->MoveData(dst_offset, src_offset, size);
    }
    WriteU32Leb128At(stream_, offset, size, desc);
    stream_->AddOffset(delta);
    return delta;
  } else {
    Offset size = stream_->offset() - offset - MAX_U32_LEB128_BYTES;
    WriteFixedU32Leb128At(stream_, offset, size, desc);
    return 0;
  }
}